

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void __thiscall BoolValue::BoolValue(BoolValue *this,bool value)

{
  SimpleType *this_00;
  string *namee;
  
  (this->super_Value).super_Base._vptr_Base = (_func_int **)&PTR_accept_0013d668;
  this->value = value;
  this_00 = (SimpleType *)operator_new(0x18);
  namee = (string *)operator_new(0x20);
  (namee->_M_dataplus)._M_p = (pointer)&namee->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)namee,"bool","");
  SimpleType::SimpleType(this_00,namee);
  (this->super_Value).type = this_00;
  return;
}

Assistant:

BoolValue::BoolValue(bool value): value(value)
{
    type = new SimpleType(new std::string("bool"));
}